

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O0

void __thiscall YamlGenerator::generate(YamlGenerator *this,ostream *output,ScName *stmName)

{
  bool bVar1;
  ScStateMap *this_00;
  ulong uVar2;
  reference __in;
  type *ptVar3;
  type *this_01;
  ostream *poVar4;
  type *state;
  type *name;
  _Self local_40;
  const_iterator __end1;
  const_iterator __begin1;
  ScStateMap *__range1;
  ScStateMap *states;
  ScName *stmName_local;
  ostream *output_local;
  YamlGenerator *this_local;
  
  this_00 = ScModel::states_abi_cxx11_((this->super_AbstractGenerator).m_model);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<(output,"Note: discarding a state-machine name\n");
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::begin(this_00);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
       ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,&local_40), bVar1) {
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>
           ::operator*(&__end1);
    ptVar3 = std::get<0ul,std::__cxx11::string_const,ScState>(__in);
    this_01 = std::get<1ul,std::__cxx11::string_const,ScState>(__in);
    poVar4 = std::operator<<(output,(string *)ptVar3);
    std::operator<<(poVar4,":\n");
    bVar1 = ScState::isDefined(this_01);
    if (bVar1) {
      poVar4 = std::operator<<(output,"  parent: ");
      poVar4 = std::operator<<(poVar4,(string *)this_01);
      std::operator<<(poVar4,"\n");
    }
    print(output,&this_01->historyState);
    print(output,&this_01->regions);
    print(output,&this_01->transitions);
    print(output,&this_01->deferrals);
    std::operator<<(output,"\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>
    ::operator++(&__end1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void YamlGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << name << ":\n";
        if (state.isDefined()) {
            output << "  parent: " << state.parent << "\n";
        }

        print(output, state.historyState);
        print(output, state.regions);
        print(output, state.transitions);
        print(output, state.deferrals);

        output << "\n";
    }

    output.flush();
}